

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

uint32_t __thiscall ddd::DictionaryMLT<true,_true>::new_suffix_id_(DictionaryMLT<true,_true> *this)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  _Var3;
  uint uVar4;
  pointer __p;
  ulong uVar5;
  uint uVar6;
  __uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  local_30;
  
  uVar6 = *(uint *)(this + 0x28);
  if ((ulong)uVar6 == 0xffffffff) {
    lVar1 = *(long *)(this + 0x10);
    lVar2 = *(long *)(this + 0x18);
    local_30._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl =
         (tuple<ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
          )operator_new(0x70);
    *(undefined8 *)
     local_30._M_t.
     super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
     .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl = 0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 8) =
         (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x10) =
         (pointer)0x0;
    (((vector<char,_std::allocator<char>_> *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x20) =
         (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x28) =
         (pointer)0x0;
    (((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x30))->
    super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x38) =
         (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x40) =
         (pointer)0x0;
    (((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x48))->
    super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x50) =
         (pointer)0x0;
    *(pointer *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x58) =
         (pointer)0x0;
    *(undefined8 *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x60) =
         0xffffffff;
    *(uint32_t *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl + 0x68) = 0
    ;
    std::
    vector<std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>>>
    ::
    emplace_back<std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>>
              ((vector<std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>>>
                *)(this + 0x10),
               (unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                *)&local_30);
    _Var3._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
         .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl;
    uVar6 = (uint)((ulong)(lVar2 - lVar1) >> 3);
    if ((_Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
         )local_30._M_t.
          super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
          .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl !=
        (DaTrie<true,_true,_false> *)0x0) {
      DaTrie<true,_true,_false>::~DaTrie
                ((DaTrie<true,_true,_false> *)
                 local_30._M_t.
                 super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                 .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl);
      operator_delete((void *)_Var3._M_t.
                              super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                              .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>.
                              _M_head_impl);
    }
  }
  else {
    __p = (pointer)operator_new(0x70);
    (__p->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (__p->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    (__p->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    (__p->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__p->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__p->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__p->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __p->head_pos_ = 0xffffffff;
    __p->bc_emps_ = 0;
    __p->tail_emps_ = 0;
    std::
    __uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
             *)((ulong)uVar6 * 8 + *(long *)(this + 0x10)),__p);
    uVar5 = (ulong)*(uint *)(this + 0x28);
    do {
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      if ((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) <= uVar5) goto LAB_00126d43;
    } while (*(long *)(*(long *)(this + 0x10) + uVar5 * 8) != 0);
    *(uint *)(this + 0x28) = uVar4;
LAB_00126d43:
    if (*(uint *)(this + 0x28) == uVar6) {
      *(undefined4 *)(this + 0x28) = 0xffffffff;
    }
  }
  return uVar6;
}

Assistant:

uint32_t new_suffix_id_() {
    if (suffix_head_ == NOT_FOUND) {
      auto suffix_id = static_cast<uint32_t>(suffix_subtries_.size());
      suffix_subtries_.push_back(make_unique<SuffixTrieType>());
      return suffix_id;
    }

    auto suffix_id = suffix_head_;
    suffix_subtries_[suffix_id] = make_unique<SuffixTrieType>();

    for (auto i = suffix_head_ + 1; i < suffix_subtries_.size(); ++i) {
      if (!suffix_subtries_[i]) {
        suffix_head_ = i;
        break;
      }
    }
    if (suffix_head_ == suffix_id) {
      suffix_head_ = NOT_FOUND;
    }
    return suffix_id;
  }